

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

int __thiscall cppcms::http::context::translate_exception(context *this)

{
  int extraout_EAX;
  abort_upload *e;
  exception *e_1;
  exception *in_stack_000001f0;
  context *in_stack_000001f8;
  
  __cxa_rethrow();
  make_error_message(in_stack_000001f8,in_stack_000001f0);
  return extraout_EAX;
}

Assistant:

int context::translate_exception()
{
	try {
		throw;
	}
	catch(abort_upload const &e) {
		return e.code();
	}
	catch(std::exception const &e) {
		make_error_message(e);
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception";
		return 500;
	}
	return 0;
}